

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::deSerializeDouble
          (btQuantizedBvh *this,btQuantizedBvhDoubleData *quantizedBvhDoubleData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  char *pcVar4;
  uint uVar5;
  btQuantizedBvhNode *ptr;
  btQuantizedBvhNodeData *pbVar6;
  btBvhSubtreeInfo *pbVar7;
  btBvhSubtreeInfoData *pbVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  btOptimizedBvhNode *pbVar19;
  btOptimizedBvhNodeDoubleData *pbVar20;
  btQuantizedBvhNode *pbVar21;
  btBvhSubtreeInfo *pbVar22;
  long lVar23;
  int *piVar24;
  int i;
  ulong uVar25;
  btOptimizedBvhNode *pbVar26;
  
  lVar18 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhAabbMax).m_floats + lVar18;
    *(ulong *)((this->m_bvhAabbMax).m_floats + lVar18) = CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 4);
  lVar18 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhAabbMin).m_floats + lVar18;
    *(ulong *)((this->m_bvhAabbMin).m_floats + lVar18) = CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 4);
  lVar18 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhQuantization).m_floats + lVar18;
    *(ulong *)((this->m_bvhQuantization).m_floats + lVar18) =
         CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar18 = lVar18 + 2;
  } while (lVar18 != 4);
  this->m_curNodeIndex = quantizedBvhDoubleData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhDoubleData->m_useQuantization != 0;
  uVar5 = quantizedBvhDoubleData->m_numContiguousLeafNodes;
  uVar17 = (this->m_contiguousNodes).m_size;
  if ((int)uVar17 < (int)uVar5) {
    lVar18 = (long)(int)uVar17;
    if ((this->m_contiguousNodes).m_capacity < (int)uVar5) {
      if (uVar5 == 0) {
        pbVar19 = (btOptimizedBvhNode *)0x0;
      }
      else {
        pbVar19 = (btOptimizedBvhNode *)btAlignedAllocInternal((long)(int)uVar5 << 6,0x10);
        uVar17 = (this->m_contiguousNodes).m_size;
      }
      if (0 < (int)uVar17) {
        lVar23 = 0;
        do {
          pbVar26 = (this->m_contiguousNodes).m_data;
          puVar1 = (undefined8 *)((long)(pbVar26->m_aabbMinOrg).m_floats + lVar23);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pbVar26->m_aabbMaxOrg).m_floats + lVar23);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          uVar13 = *(undefined8 *)(pbVar26->m_padding + lVar23 + -0xc);
          uVar14 = *(undefined8 *)(pbVar26->m_padding + lVar23 + -0xc + 8);
          uVar15 = *(undefined8 *)(pbVar26->m_padding + lVar23 + 4 + 8);
          *(undefined8 *)(pbVar19->m_padding + lVar23 + 4) =
               *(undefined8 *)(pbVar26->m_padding + lVar23 + 4);
          *(undefined8 *)(pbVar19->m_padding + lVar23 + 4 + 8) = uVar15;
          *(undefined8 *)(pbVar19->m_padding + lVar23 + -0xc) = uVar13;
          *(undefined8 *)(pbVar19->m_padding + lVar23 + -0xc + 8) = uVar14;
          puVar1 = (undefined8 *)((long)(pbVar19->m_aabbMaxOrg).m_floats + lVar23);
          *puVar1 = uVar11;
          puVar1[1] = uVar12;
          puVar1 = (undefined8 *)((long)(pbVar19->m_aabbMinOrg).m_floats + lVar23);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          lVar23 = lVar23 + 0x40;
        } while ((ulong)uVar17 << 6 != lVar23);
      }
      pbVar26 = (this->m_contiguousNodes).m_data;
      if ((pbVar26 != (btOptimizedBvhNode *)0x0) && ((this->m_contiguousNodes).m_ownsMemory == true)
         ) {
        btAlignedFreeInternal(pbVar26);
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pbVar19;
      (this->m_contiguousNodes).m_capacity = uVar5;
    }
    lVar23 = (int)uVar5 - lVar18;
    lVar18 = lVar18 << 6;
    do {
      pbVar19 = (this->m_contiguousNodes).m_data;
      pcVar4 = pbVar19->m_padding + lVar18 + 4;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      pcVar4 = pbVar19->m_padding + lVar18 + -0xc;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      puVar1 = (undefined8 *)((long)(pbVar19->m_aabbMaxOrg).m_floats + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pbVar19->m_aabbMinOrg).m_floats + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar18 = lVar18 + 0x40;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  (this->m_contiguousNodes).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar20 = quantizedBvhDoubleData->m_contiguousNodesPtr;
    pbVar19 = (this->m_contiguousNodes).m_data;
    uVar25 = 0;
    pbVar26 = pbVar19;
    do {
      lVar18 = 4;
      do {
        pdVar3 = (pbVar20->m_aabbMinOrg).m_floats + lVar18;
        *(ulong *)((pbVar26->m_aabbMinOrg).m_floats + lVar18) =
             CONCAT44((float)pdVar3[1],(float)*pdVar3);
        lVar18 = lVar18 + 2;
      } while (lVar18 != 8);
      lVar18 = 0;
      do {
        pdVar3 = (pbVar20->m_aabbMinOrg).m_floats + lVar18;
        *(ulong *)((pbVar26->m_aabbMinOrg).m_floats + lVar18) =
             CONCAT44((float)pdVar3[1],(float)*pdVar3);
        lVar18 = lVar18 + 2;
      } while (lVar18 != 4);
      iVar16 = pbVar20->m_subPart;
      pbVar19[uVar25].m_escapeIndex = pbVar20->m_escapeIndex;
      pbVar19[uVar25].m_subPart = iVar16;
      pbVar19[uVar25].m_triangleIndex = pbVar20->m_triangleIndex;
      uVar25 = uVar25 + 1;
      pbVar20 = pbVar20 + 1;
      pbVar26 = pbVar26 + 1;
    } while (uVar25 != uVar5);
  }
  uVar5 = quantizedBvhDoubleData->m_numQuantizedContiguousNodes;
  uVar17 = (this->m_quantizedContiguousNodes).m_size;
  if ((int)uVar17 < (int)uVar5) {
    lVar18 = (long)(int)uVar17;
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar5) {
      if (uVar5 == 0) {
        pbVar21 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar21 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)(int)uVar5 << 4,0x10);
        uVar17 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar17) {
        lVar23 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar23);
          uVar9 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar21->m_quantizedAabbMin + lVar23);
          *puVar2 = *puVar1;
          puVar2[1] = uVar9;
          lVar23 = lVar23 + 0x10;
        } while ((ulong)uVar17 << 4 != lVar23);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr != (btQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar21;
      (this->m_quantizedContiguousNodes).m_capacity = uVar5;
    }
    lVar23 = (int)uVar5 - lVar18;
    lVar18 = lVar18 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar18 = lVar18 + 0x10;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar6 = quantizedBvhDoubleData->m_quantizedContiguousNodesPtr;
    pbVar21 = (this->m_quantizedContiguousNodes).m_data;
    lVar18 = 0;
    do {
      *(undefined4 *)((long)pbVar21->m_quantizedAabbMax + lVar18 + 6) =
           *(undefined4 *)((long)pbVar6->m_quantizedAabbMax + lVar18 + 6);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMax + lVar18) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar18);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMax + lVar18 + 2) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar18 + 2);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMax + lVar18 + 4) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar18 + 4);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMin + lVar18) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar18);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMin + lVar18 + 2) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar18 + 2);
      *(undefined2 *)((long)pbVar21->m_quantizedAabbMin + lVar18 + 4) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar18 + 4);
      lVar18 = lVar18 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar18);
  }
  this->m_traversalMode = quantizedBvhDoubleData->m_traversalMode;
  uVar5 = quantizedBvhDoubleData->m_numSubtreeHeaders;
  uVar17 = (this->m_SubtreeHeaders).m_size;
  if (((int)uVar17 < (int)uVar5) && ((this->m_SubtreeHeaders).m_capacity < (int)uVar5)) {
    if (uVar5 == 0) {
      pbVar22 = (btBvhSubtreeInfo *)0x0;
    }
    else {
      pbVar22 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)(int)uVar5 << 5,0x10);
      uVar17 = (this->m_SubtreeHeaders).m_size;
    }
    if (0 < (int)uVar17) {
      lVar18 = 0;
      do {
        pbVar7 = (this->m_SubtreeHeaders).m_data;
        puVar1 = (undefined8 *)((long)pbVar7->m_quantizedAabbMin + lVar18);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)pbVar7->m_padding + lVar18 + -4);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar22->m_padding + lVar18 + -4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        puVar1 = (undefined8 *)((long)pbVar22->m_quantizedAabbMin + lVar18);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        lVar18 = lVar18 + 0x20;
      } while ((ulong)uVar17 << 5 != lVar18);
    }
    pbVar7 = (this->m_SubtreeHeaders).m_data;
    if ((pbVar7 != (btBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar7);
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pbVar22;
    (this->m_SubtreeHeaders).m_capacity = uVar5;
  }
  (this->m_SubtreeHeaders).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar8 = quantizedBvhDoubleData->m_subTreeInfoPtr;
    piVar24 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    lVar18 = 0;
    do {
      *(unsigned_short *)((long)piVar24 + -6) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar18);
      *(unsigned_short *)(piVar24 + -1) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar18 + 2);
      *(unsigned_short *)((long)piVar24 + -2) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar18 + 4);
      ((btBvhSubtreeInfo *)(piVar24 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar18);
      *(unsigned_short *)((long)piVar24 + -10) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar18 + 2);
      *(unsigned_short *)(piVar24 + -2) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar18 + 4);
      *(undefined8 *)piVar24 = *(undefined8 *)((long)pbVar8->m_quantizedAabbMin + lVar18 + -8);
      piVar24 = piVar24 + 8;
      lVar18 = lVar18 + 0x14;
    } while ((ulong)uVar5 * 0x14 != lVar18);
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeDouble(struct btQuantizedBvhDoubleData& quantizedBvhDoubleData)
{
	m_bvhAabbMax.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeDouble(quantizedBvhDoubleData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhDoubleData.m_curNodeIndex;
	m_useQuantization = quantizedBvhDoubleData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhDoubleData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeDoubleData* memPtr = quantizedBvhDoubleData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeDouble(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeDouble(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhDoubleData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhDoubleData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhDoubleData.m_traversalMode);
	
	{
		int numElem = quantizedBvhDoubleData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhDoubleData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}

}